

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void to_top_or_bottom_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,bool to_top,
               Am_Value *new_sel)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *in_value;
  Am_Object group;
  Am_Value_List objs;
  Am_Object obj;
  Am_Value_List places;
  Am_Object selection_widget;
  Am_Object local_c0;
  Am_Value_List local_b8;
  Am_Object local_a8;
  Am_Value_List local_a0;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Value local_70;
  Am_Value_List local_60;
  Am_Value_List local_50;
  Am_Object local_40;
  Am_Object local_38;
  
  local_78.data = (Am_Object_Data *)0x0;
  local_a8.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_b8);
  Am_Object::Am_Object(&local_80,command_obj);
  Am_Get_Selection_Widget_For_Command((Am_Object *)&local_a0);
  Am_Object::operator=(&local_78,(Am_Object *)&local_a0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Object::~Am_Object(&local_80);
  pAVar3 = Am_Object::Get(command_obj,0x16d,0);
  Am_Value_List::operator=(&local_b8,pAVar3);
  if (undo) {
    if (selective) {
      Am_Error("Selective Undo of to top not allowed");
    }
    pAVar3 = Am_Object::Get(command_obj,0x16f,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    if (bVar1) {
      if (to_top) {
        Am_Value_List::Start(&local_b8);
        while( true ) {
          bVar2 = Am_Value_List::Last(&local_b8);
          if (bVar2) break;
          pAVar3 = Am_Value_List::Get(&local_b8);
          Am_Object::operator=(&local_a8,pAVar3);
          Am_Object::Am_Object(&local_38,&local_a8);
          Am_To_Top(&local_38);
          Am_Object::~Am_Object(&local_38);
          Am_Value_List::Next(&local_b8);
        }
      }
      else {
        Am_Value_List::End(&local_b8);
        while( true ) {
          bVar2 = Am_Value_List::First(&local_b8);
          if (bVar2) break;
          pAVar3 = Am_Value_List::Get(&local_b8);
          Am_Object::operator=(&local_a8,pAVar3);
          Am_Object::Am_Object(&local_40,&local_a8);
          Am_To_Bottom(&local_40);
          Am_Object::~Am_Object(&local_40);
          Am_Value_List::Prev(&local_b8);
        }
      }
    }
    else {
      local_c0.data = (Am_Object_Data *)0x0;
      Am_Value_List::Am_Value_List(&local_a0);
      pAVar3 = Am_Object::Get(command_obj,0x171,0);
      Am_Object::operator=(&local_c0,pAVar3);
      pAVar3 = Am_Object::Get(command_obj,0x1e4,0);
      Am_Value_List::operator=(&local_a0,pAVar3);
      Am_Object::Am_Object(&local_88,&local_c0);
      Am_Value_List::Am_Value_List(&local_50,&local_b8);
      Am_Value_List::Am_Value_List(&local_60,&local_a0);
      Am_Put_Objects_Back_In_Place(&local_88,&local_50,&local_60,false);
      Am_Value_List::~Am_Value_List(&local_60);
      Am_Value_List::~Am_Value_List(&local_50);
      Am_Object::~Am_Object(&local_88);
      Am_Value_List::~Am_Value_List(&local_a0);
      Am_Object::~Am_Object(&local_c0);
    }
    Am_Object::Set(command_obj,0x16f,!bVar1,0);
  }
  else {
    if (!reload_data) {
      in_value = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_b8);
      Am_Value::operator=(new_sel,in_value);
    }
    Am_Object::Am_Object(&local_90,command_obj);
    Am_Value::Am_Value(&local_70,new_sel);
    do_to_top_or_bottom(&local_90,to_top,&local_70);
    Am_Value::~Am_Value(&local_70);
    Am_Object::~Am_Object(&local_90);
  }
  Am_Value_List::~Am_Value_List(&local_b8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_78);
  return;
}

Assistant:

void
to_top_or_bottom_general_undo_redo(Am_Object command_obj, bool undo,
                                   bool selective, bool reload_data,
                                   bool to_top, Am_Value new_sel = Am_No_Value)
{
  Am_Object selection_widget, obj;
  Am_Value_List objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  objs = command_obj.Get(Am_OBJECT_MODIFIED);

  if (undo) {
    if (selective)
      Am_Error("Selective Undo of to top not allowed");
    bool currently_undone = command_obj.Get(Am_HAS_BEEN_UNDONE);
    if (currently_undone) { // then redo = move objects to
                            // top or bottom again.  Assume places is still OK
      if (to_top) {
        for (objs.Start(); !objs.Last(); objs.Next()) {
          obj = objs.Get();
          Am_To_Top(obj);
        }
      } else {
        // have to go through the list in reverse order
        for (objs.End(); !objs.First(); objs.Prev()) {
          obj = objs.Get();
          Am_To_Bottom(obj);
        }
      }
    } else { // regular undo; restore the objects to where they were
      Am_Object group;
      Am_Value_List places;
      group = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
      places = command_obj.Get(Am_OBJECT_MODIFIED_PLACES);
      Am_Put_Objects_Back_In_Place(group, objs, places, false);
    }
    command_obj.Set(Am_HAS_BEEN_UNDONE, !currently_undone);
  } else { // repeat, to top or bottom again
    if (!reload_data)
      new_sel = objs;
    do_to_top_or_bottom(command_obj, to_top, new_sel);
  }
}